

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O1

int save_image_as_DDS(char *filename,int width,int height,int channels,uchar *data)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  uchar *__ptr;
  FILE *__s;
  int DDS_size;
  DDS_header header;
  int local_ac;
  undefined8 local_a8;
  undefined4 uStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar1 = 0;
  iVar3 = 0;
  if ((((data != (uchar *)0x0) && (iVar3 = 0, filename != (char *)0x0)) &&
      (iVar3 = iVar1, 0 < width)) && ((0 < height && (0xfffffffb < channels - 5U)))) {
    if ((channels & 1U) == 0) {
      __ptr = convert_image_to_DXT5(data,width,height,channels,&local_ac);
      uVar2 = 0x35545844;
    }
    else {
      __ptr = convert_image_to_DXT1(data,width,height,channels,&local_ac);
      uVar2 = 0x31545844;
    }
    uStack_90 = 0;
    local_68 = 0;
    uStack_50 = 0;
    local_48 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_a8 = 0x7c20534444;
    _uStack_a0 = CONCAT44(height,0x81007);
    _local_98 = CONCAT44(local_ac,width);
    uStack_60 = 0x2000000000;
    _local_58 = CONCAT44(uVar2,4);
    uStack_40 = 0x100000000000;
    __s = fopen(filename,"wb");
    fwrite(&local_a8,0x80,1,__s);
    fwrite(__ptr,1,(long)local_ac,__s);
    fclose(__s);
    free(__ptr);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
	save_image_as_DDS
	(
		const char *filename,
		int width, int height, int channels,
		const unsigned char *const data
	)
{
	/*	variables	*/
	FILE *fout;
	unsigned char *DDS_data;
	DDS_header header;
	int DDS_size;
	/*	error check	*/
	if( (NULL == filename) ||
		(width < 1) || (height < 1) ||
		(channels < 1) || (channels > 4) ||
		(data == NULL ) )
	{
		return 0;
	}
	/*	Convert the image	*/
	if( (channels & 1) == 1 )
	{
		/*	no alpha, just use DXT1	*/
		DDS_data = convert_image_to_DXT1( data, width, height, channels, &DDS_size );
	} else
	{
		/*	has alpha, so use DXT5	*/
		DDS_data = convert_image_to_DXT5( data, width, height, channels, &DDS_size );
	}
	/*	save it	*/
	memset( &header, 0, sizeof( DDS_header ) );
	header.dwMagic = ('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24);
	header.dwSize = 124;
	header.dwFlags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT | DDSD_LINEARSIZE;
	header.dwWidth = width;
	header.dwHeight = height;
	header.dwPitchOrLinearSize = DDS_size;
	header.sPixelFormat.dwSize = 32;
	header.sPixelFormat.dwFlags = DDPF_FOURCC;
	if( (channels & 1) == 1 )
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('1' << 24);
	} else
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('5' << 24);
	}
	header.sCaps.dwCaps1 = DDSCAPS_TEXTURE;
	/*	write it out	*/
	fout = fopen( filename, "wb");
	fwrite( &header, sizeof( DDS_header ), 1, fout );
	fwrite( DDS_data, 1, DDS_size, fout );
	fclose( fout );
	/*	done	*/
	free( DDS_data );
	return 1;
}